

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O3

void * __thiscall
chrono::ChClassRegistration<chrono::ChConstraintNgeneric>::create
          (ChClassRegistration<chrono::ChConstraintNgeneric> *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)::operator_new(0x90);
  *(undefined4 *)(puVar1 + 5) = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  *(undefined1 *)((long)puVar1 + 0x2c) = 1;
  *(undefined4 *)(puVar1 + 6) = 1;
  puVar1[7] = 0;
  *puVar1 = &PTR__ChConstraintNgeneric_00b3b560;
  *(undefined1 (*) [64])(puVar1 + 9) = ZEXT464(0) << 0x40;
  puVar1[0x11] = 0;
  return puVar1;
}

Assistant:

virtual void* create() {
        return _create();
    }